

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void mg_send_dns_query(mg_connection *nc,char *name,int query_type)

{
  mg_connection *nc_00;
  undefined2 uVar1;
  int iVar2;
  void *__ptr;
  char *pcVar3;
  size_t nlen;
  mbuf pkt;
  uint16_t len;
  mbuf local_68;
  mg_connection *local_48;
  ushort local_40;
  undefined4 uStack_3e;
  ushort uStack_3a;
  undefined4 local_38;
  
  __ptr = calloc(1,0xc20);
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_send_dns_query");
    cs_log_printf("%s %d",name,(ulong)(uint)query_type);
  }
  local_68.buf = (char *)0x0;
  local_68.len = 0;
  local_68.size = 0;
  local_48 = nc;
  pcVar3 = (char *)realloc((void *)0x0,0x40);
  if (pcVar3 != (char *)0x0) {
    local_68.size = 0x40;
    local_68.buf = pcVar3;
  }
  mg_dns_tid = mg_dns_tid + 1;
  uVar1 = (undefined2)mg_dns_tid;
  *(undefined2 *)((long)__ptr + 0x12) = uVar1;
  *(undefined2 *)((long)__ptr + 0x10) = 0x100;
  *(undefined4 *)((long)__ptr + 0x14) = 1;
  local_38 = 0;
  _local_40 = CONCAT26(*(ushort *)((long)__ptr + 0x18) << 8 | *(ushort *)((long)__ptr + 0x18) >> 8,
                       CONCAT42(0x1000001,uVar1));
  mbuf_insert(&local_68,0,&local_40,0xc);
  *(int *)((long)__ptr + 0x30) = query_type;
  *(undefined4 *)((long)__ptr + 0x34) = 1;
  *(undefined4 *)((long)__ptr + 0x3c) = 1;
  nlen = strlen(name);
  iVar2 = mg_dns_encode_record
                    (&local_68,(mg_dns_resource_record *)((long)__ptr + 0x20),name,nlen,(void *)0x0,
                     0);
  nc_00 = local_48;
  if (iVar2 != -1) {
    if ((local_48->flags & 2) == 0) {
      _local_40 = CONCAT62(_uStack_3e,(ushort)local_68.len << 8 | (ushort)local_68.len >> 8);
      mbuf_insert(&local_68,0,&local_40,2);
    }
    mg_send(nc_00,local_68.buf,(int)local_68.len);
    mbuf_free(&local_68);
  }
  free(__ptr);
  return;
}

Assistant:

void mg_send_dns_query(struct mg_connection *nc, const char *name,
                       int query_type) {
    struct mg_dns_message *msg =
            (struct mg_dns_message *) MG_CALLOC(1, sizeof(*msg));
    struct mbuf pkt;
    struct mg_dns_resource_record *rr = &msg->questions[0];

    DBG(("%s %d", name, query_type));

    mbuf_init(&pkt, 64 /* Start small, it'll grow as needed. */);

    msg->transaction_id = ++mg_dns_tid;
    msg->flags = 0x100;
    msg->num_questions = 1;

    mg_dns_insert_header(&pkt, 0, msg);

    rr->rtype = query_type;
    rr->rclass = 1; /* Class: inet */
    rr->kind = MG_DNS_QUESTION;

    if (mg_dns_encode_record(&pkt, rr, name, strlen(name), NULL, 0) == -1) {
        /* TODO(mkm): return an error code */
        goto cleanup; /* LCOV_EXCL_LINE */
    }

    /* TCP DNS requires messages to be prefixed with len */
    if (!(nc->flags & MG_F_UDP)) {
        uint16_t len = htons(pkt.len);
        mbuf_insert(&pkt, 0, &len, 2);
    }

    mg_send(nc, pkt.buf, pkt.len);
    mbuf_free(&pkt);

    cleanup:
    MG_FREE(msg);
}